

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O0

_Bool bson_append_timeval(bson_t *bson,char *key,int key_length,timeval *value)

{
  _Bool _Var1;
  uint64_t unix_msec;
  timeval *value_local;
  int key_length_local;
  char *key_local;
  bson_t *bson_local;
  
  if (bson == (bson_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson.c",
            0x6f4,"bson_append_timeval","bson");
    abort();
  }
  if (key == (char *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson.c",
            0x6f5,"bson_append_timeval","key");
    abort();
  }
  if (value == (timeval *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson.c",
            0x6f6,"bson_append_timeval","value");
    abort();
  }
  _Var1 = bson_append_date_time
                    (bson,key,key_length,value->tv_sec * 1000 + (ulong)value->tv_usec / 1000);
  return _Var1;
}

Assistant:

bool
bson_append_timeval (bson_t *bson,
                     const char *key,
                     int key_length,
                     struct timeval *value)
{
   uint64_t unix_msec;

   BSON_ASSERT (bson);
   BSON_ASSERT (key);
   BSON_ASSERT (value);

   unix_msec =
      (((uint64_t) value->tv_sec) * 1000UL) + (value->tv_usec / 1000UL);
   return bson_append_date_time (bson, key, key_length, unix_msec);
}